

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void bagotricks_monster(obj *bag,boolean use_charge)

{
  bool bVar1;
  int iVar2;
  monst *pmVar3;
  undefined4 local_18;
  boolean gotone;
  int cnt;
  boolean use_charge_local;
  obj *bag_local;
  
  local_18 = 1;
  bVar1 = false;
  if (use_charge != '\0') {
    consume_obj_charge(bag,'\x01');
  }
  iVar2 = rn2(0x17);
  if (iVar2 == 0) {
    iVar2 = rn2(7);
    local_18 = iVar2 + 2;
  }
  while (iVar2 = local_18 + -1, 0 < local_18) {
    pmVar3 = makemon((permonst *)0x0,level,(int)u.ux,(int)u.uy,0);
    local_18 = iVar2;
    if (pmVar3 != (monst *)0x0) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    discover_object(0xe1,'\x01','\x01');
  }
  return;
}

Assistant:

void bagotricks_monster(struct obj *bag, boolean use_charge)
{
	int cnt = 1;
	boolean gotone = FALSE;

	if (use_charge)
	    consume_obj_charge(bag, TRUE);

	if (!rn2(23))
	    cnt += rn1(7, 1);
	while (cnt-- > 0) {
	    if (makemon(NULL, level, u.ux, u.uy, NO_MM_FLAGS))
		gotone = TRUE;
	}
	if (gotone)
	    makeknown(BAG_OF_TRICKS);
}